

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O1

Variable __thiscall
LiteScript::_Type_CHARACTER::OMultiplyAndAssign(_Type_CHARACTER *this,Variable *obj1,Variable *obj2)

{
  bool bVar1;
  uint uVar2;
  Object *pOVar3;
  Type *pTVar4;
  Type *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar5;
  Variable VVar6;
  Variable tmp;
  Variable local_60;
  String local_50;
  
  pOVar3 = Variable::operator->((Variable *)in_RCX);
  pTVar4 = Object::GetType(pOVar3);
  bVar1 = Type::operator!=(pTVar4,(Type *)_type_number);
  if (bVar1) {
    Variable::Convert(&local_60,in_RCX);
    pOVar3 = Variable::operator->(&local_60);
    pTVar4 = Object::GetType(pOVar3);
    bVar1 = Type::operator==(pTVar4,(Type *)_type_number);
    if (bVar1) {
      pOVar3 = Variable::operator->(&local_60);
      uVar2 = Number::operator_cast_to_int((Number *)pOVar3->data);
      pOVar3 = Variable::operator->(obj2);
      Character::operator*=((Character *)pOVar3->data,uVar2);
    }
    else {
      String::String(&local_50,"");
      pOVar3 = Variable::operator->(obj2);
      Character::operator+=((Character *)pOVar3->data,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)local_50.str._M_dataplus._M_p != &local_50.str.field_2) {
        operator_delete(local_50.str._M_dataplus._M_p);
      }
    }
    Variable::Variable((Variable *)this,obj2);
    Variable::~Variable(&local_60);
    puVar5 = extraout_RDX_00;
  }
  else {
    pOVar3 = Variable::operator->((Variable *)in_RCX);
    uVar2 = Number::operator_cast_to_int((Number *)pOVar3->data);
    pOVar3 = Variable::operator->(obj2);
    Character::operator*=((Character *)pOVar3->data,uVar2);
    Variable::Variable((Variable *)this,obj2);
    puVar5 = extraout_RDX;
  }
  VVar6.nb_ref = puVar5;
  VVar6.obj = (Object *)this;
  return VVar6;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CHARACTER::OMultiplyAndAssign(LiteScript::Variable& obj1, const LiteScript::Variable& obj2) const {
    if (obj2->GetType() != Type::NUMBER) {
        Variable tmp = obj2.Convert(Type::NUMBER);
        if (tmp->GetType() == Type::NUMBER) {
            obj1->GetData<Character>() *= (unsigned int) (int) tmp->GetData<Number>();
            return obj1;
        }
        obj1->GetData<Character>() += String("");
        return obj1;
    }
    obj1->GetData<Character>() *= (unsigned int)(int)obj2->GetData<Number>();
    return obj1;
}